

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

void PruneBlockFilesManual(Chainstate *active_chainstate,int nManualPruneHeight)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  bool bVar4;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  string local_88;
  BlockValidationState state;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = &state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2;
  state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
  state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_local_buf[0] = '\0';
  paVar2 = &state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2;
  state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
  state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0] = '\0';
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)paVar1;
  state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)paVar2;
  bVar4 = Chainstate::FlushStateToDisk(active_chainstate,&state,NONE,nManualPruneHeight);
  if (!bVar4) {
    ValidationState<BlockValidationResult>::ToString_abi_cxx11_
              (&local_88,&state.super_ValidationState<BlockValidationResult>);
    logging_function._M_str = "PruneBlockFilesManual";
    logging_function._M_len = 0x15;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
    ;
    source_file._M_len = 0x5e;
    LogPrintFormatInternal<char[22],std::__cxx11::string>
              (logging_function,source_file,0x1224,ALL,Info,(ConstevalFormatString<2U>)0x821e32,
               (char (*) [22])"PruneBlockFilesManual",&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p !=
      paVar2) {
    operator_delete(state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus.
                    _M_p,CONCAT71(state.super_ValidationState<BlockValidationResult>.m_debug_message
                                  .field_2._M_allocated_capacity._1_7_,
                                  state.super_ValidationState<BlockValidationResult>.m_debug_message
                                  .field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p !=
      paVar1) {
    operator_delete(state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus.
                    _M_p,CONCAT71(state.super_ValidationState<BlockValidationResult>.m_reject_reason
                                  .field_2._M_allocated_capacity._1_7_,
                                  state.super_ValidationState<BlockValidationResult>.m_reject_reason
                                  .field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PruneBlockFilesManual(Chainstate& active_chainstate, int nManualPruneHeight)
{
    BlockValidationState state;
    if (!active_chainstate.FlushStateToDisk(
            state, FlushStateMode::NONE, nManualPruneHeight)) {
        LogPrintf("%s: failed to flush state (%s)\n", __func__, state.ToString());
    }
}